

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RefCountedObjectImpl.hpp
# Opt level: O0

ConversionStream * __thiscall
Diligent::
MakeNewRCObj<Diligent::HLSL2GLSLConverterImpl::ConversionStream,Diligent::IMemoryAllocator>::
operator()(MakeNewRCObj<Diligent::HLSL2GLSLConverterImpl::ConversionStream,Diligent::IMemoryAllocator>
           *this,HLSL2GLSLConverterImpl *CtorArgs,char **CtorArgs_1,
          IShaderSourceInputStreamFactory **CtorArgs_2,char **CtorArgs_3,unsigned_long *CtorArgs_4,
          bool *CtorArgs_5)

{
  HLSL2GLSLConverterImpl *pHVar1;
  ConversionStream *local_50;
  ConversionStream *pObj;
  IReferenceCounters *pRefCounters;
  RefCountersImpl *pNewRefCounters;
  unsigned_long *CtorArgs_local_4;
  char **CtorArgs_local_3;
  IShaderSourceInputStreamFactory **CtorArgs_local_2;
  char **CtorArgs_local_1;
  HLSL2GLSLConverterImpl *CtorArgs_local;
  MakeNewRCObj<Diligent::HLSL2GLSLConverterImpl::ConversionStream,_Diligent::IMemoryAllocator>
  *this_local;
  
  pRefCounters = (IReferenceCounters *)0x0;
  pHVar1 = CtorArgs;
  if (*(long *)(this + 8) == 0) {
    pObj = (ConversionStream *)::operator_new(0x30);
    RefCountersImpl::RefCountersImpl((RefCountersImpl *)pObj);
    pRefCounters = (IReferenceCounters *)pObj;
  }
  else {
    pObj = (ConversionStream *)(**(code **)(**(long **)(this + 8) + 0x18))();
  }
  if (*(long *)this == 0) {
    local_50 = (ConversionStream *)
               RefCountedObject<Diligent::IHLSL2GLSLConversionStream>::operator_new
                         ((RefCountedObject<Diligent::IHLSL2GLSLConversionStream> *)0xe0,
                          (size_t)pHVar1);
    HLSL2GLSLConverterImpl::ConversionStream::ConversionStream
              (local_50,(IReferenceCounters *)pObj,CtorArgs,*CtorArgs_1,*CtorArgs_2,*CtorArgs_3,
               *CtorArgs_4,(bool)(*CtorArgs_5 & 1));
  }
  else {
    local_50 = (ConversionStream *)
               new<Diligent::IMemoryAllocator>
                         (0xe0,*(IMemoryAllocator **)this,*(Char **)(this + 0x10),
                          *(char **)(this + 0x18),*(Int32 *)(this + 0x20));
    HLSL2GLSLConverterImpl::ConversionStream::ConversionStream
              (local_50,(IReferenceCounters *)pObj,CtorArgs,*CtorArgs_1,*CtorArgs_2,*CtorArgs_3,
               *CtorArgs_4,(bool)(*CtorArgs_5 & 1));
  }
  if (pRefCounters != (IReferenceCounters *)0x0) {
    RefCountersImpl::
    Attach<Diligent::HLSL2GLSLConverterImpl::ConversionStream,Diligent::IMemoryAllocator>
              ((RefCountersImpl *)pRefCounters,local_50,*(IMemoryAllocator **)this);
  }
  return local_50;
}

Assistant:

ObjectType* operator()(CtorArgTypes&&... CtorArgs)
    {
        RefCountersImpl*    pNewRefCounters = nullptr;
        IReferenceCounters* pRefCounters    = nullptr;
        if (m_pOwner != nullptr)
            pRefCounters = m_pOwner->GetReferenceCounters();
        else
        {
            // Constructor of RefCountersImpl class is private and only accessible
            // by methods of MakeNewRCObj
            pNewRefCounters = new RefCountersImpl{};
            pRefCounters    = pNewRefCounters;
        }
        ObjectType* pObj = nullptr;
        try
        {
#ifndef DILIGENT_DEVELOPMENT
            static constexpr const char* m_dvpDescription = "<Unavailable in release build>";
            static constexpr const char* m_dvpFileName    = "<Unavailable in release build>";
            static constexpr Int32       m_dvpLineNumber  = -1;
#endif
            // Operators new and delete of RefCountedObject are private and only accessible
            // by methods of MakeNewRCObj
            if (m_pAllocator)
                pObj = new (*m_pAllocator, m_dvpDescription, m_dvpFileName, m_dvpLineNumber) ObjectType{pRefCounters, std::forward<CtorArgTypes>(CtorArgs)...};
            else
                pObj = new ObjectType{pRefCounters, std::forward<CtorArgTypes>(CtorArgs)...};
            if (pNewRefCounters != nullptr)
                pNewRefCounters->Attach<ObjectType, AllocatorType>(pObj, m_pAllocator);
        }
        catch (...)
        {
            if (pNewRefCounters != nullptr)
                pNewRefCounters->SelfDestroy();
            throw;
        }
        return pObj;
    }